

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_block_error_intrin_avx2.c
# Opt level: O1

int64_t av1_highbd_block_error_avx2
                  (tran_low_t *coeff,tran_low_t *dqcoeff,intptr_t block_size,int64_t *ssz,int bps)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  long lVar8;
  ulong uVar9;
  byte bVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [64];
  
  auVar12 = ZEXT1664((undefined1  [16])0x0);
  auVar11 = (undefined1  [16])0x0;
  if (0 < block_size) {
    lVar8 = 0;
    do {
      auVar1 = *(undefined1 (*) [32])(coeff + lVar8);
      auVar2 = *(undefined1 (*) [32])(coeff + lVar8 + 8);
      auVar6 = vpsubd_avx2(auVar1,*(undefined1 (*) [32])(dqcoeff + lVar8));
      auVar7 = vpsubd_avx2(auVar2,*(undefined1 (*) [32])(dqcoeff + lVar8 + 8));
      auVar5 = vpmuldq_avx2(auVar6,auVar6);
      auVar6 = vpshufd_avx2(auVar6,0xf5);
      auVar6 = vpmuldq_avx2(auVar6,auVar6);
      auVar5 = vpaddq_avx2(auVar5,auVar6);
      auVar6 = vpmuldq_avx2(auVar7,auVar7);
      auVar7 = vpshufd_avx2(auVar7,0xf5);
      auVar7 = vpmuldq_avx2(auVar7,auVar7);
      auVar6 = vpaddq_avx2(auVar7,auVar6);
      auVar5 = vpaddq_avx2(auVar5,auVar6);
      auVar6 = vpmuldq_avx2(auVar1,auVar1);
      auVar1 = vpshufd_avx2(auVar1,0xf5);
      auVar1 = vpmuldq_avx2(auVar1,auVar1);
      auVar1 = vpaddq_avx2(auVar6,auVar1);
      auVar6 = vpmuldq_avx2(auVar2,auVar2);
      auVar2 = vpshufd_avx2(auVar2,0xf5);
      auVar2 = vpmuldq_avx2(auVar2,auVar2);
      auVar2 = vpaddq_avx2(auVar2,auVar6);
      auVar1 = vpaddq_avx2(auVar1,auVar2);
      auVar11 = vpunpckhqdq_avx(auVar1._0_16_,auVar5._0_16_);
      auVar11 = vpaddq_avx(auVar11,auVar12._0_16_);
      auVar3 = vpunpcklqdq_avx(auVar1._0_16_,auVar5._0_16_);
      auVar11 = vpaddq_avx(auVar11,auVar3);
      auVar4 = vpunpcklqdq_avx(auVar1._16_16_,auVar5._16_16_);
      auVar3 = vpunpckhqdq_avx(auVar1._16_16_,auVar5._16_16_);
      auVar3 = vpaddq_avx(auVar4,auVar3);
      auVar11 = vpaddq_avx(auVar11,auVar3);
      auVar12 = ZEXT1664(auVar11);
      lVar8 = lVar8 + 0x10;
    } while (lVar8 < block_size);
  }
  bVar10 = (char)bps * '\x02' - 0x10;
  uVar9 = (ulong)((uint)(1 << (bVar10 & 0x1f)) >> 1);
  lVar8 = vpextrq_avx(auVar11,1);
  *ssz = (long)(auVar11._0_8_ + uVar9) >> (bVar10 & 0x3f);
  return (long)(lVar8 + uVar9) >> (bVar10 & 0x3f);
}

Assistant:

int64_t av1_highbd_block_error_avx2(const tran_low_t *coeff,
                                    const tran_low_t *dqcoeff,
                                    intptr_t block_size, int64_t *ssz,
                                    int bps) {
  int i;
  int64_t temp1[8];
  int64_t error = 0, sqcoeff = 0;
  const int shift = 2 * (bps - 8);
  const int rounding = (1 << shift) >> 1;

  for (i = 0; i < block_size; i += 16) {
    __m256i mm256_coeff = _mm256_loadu_si256((__m256i *)(coeff + i));
    __m256i mm256_coeff2 = _mm256_loadu_si256((__m256i *)(coeff + i + 8));
    __m256i mm256_dqcoeff = _mm256_loadu_si256((__m256i *)(dqcoeff + i));
    __m256i mm256_dqcoeff2 = _mm256_loadu_si256((__m256i *)(dqcoeff + i + 8));

    __m256i diff1 = _mm256_sub_epi32(mm256_coeff, mm256_dqcoeff);
    __m256i diff2 = _mm256_sub_epi32(mm256_coeff2, mm256_dqcoeff2);
    __m256i diff1h = _mm256_srli_epi64(diff1, 32);
    __m256i diff2h = _mm256_srli_epi64(diff2, 32);
    __m256i res = _mm256_mul_epi32(diff1, diff1);
    __m256i res1 = _mm256_mul_epi32(diff1h, diff1h);
    __m256i res2 = _mm256_mul_epi32(diff2, diff2);
    __m256i res3 = _mm256_mul_epi32(diff2h, diff2h);
    __m256i res_diff = _mm256_add_epi64(_mm256_add_epi64(res, res1),
                                        _mm256_add_epi64(res2, res3));
    __m256i mm256_coeffh = _mm256_srli_epi64(mm256_coeff, 32);
    __m256i mm256_coeffh2 = _mm256_srli_epi64(mm256_coeff2, 32);
    res = _mm256_mul_epi32(mm256_coeff, mm256_coeff);
    res1 = _mm256_mul_epi32(mm256_coeffh, mm256_coeffh);
    res2 = _mm256_mul_epi32(mm256_coeff2, mm256_coeff2);
    res3 = _mm256_mul_epi32(mm256_coeffh2, mm256_coeffh2);
    __m256i res_sqcoeff = _mm256_add_epi64(_mm256_add_epi64(res, res1),
                                           _mm256_add_epi64(res2, res3));
    _mm256_storeu_si256((__m256i *)temp1, res_diff);
    _mm256_storeu_si256((__m256i *)temp1 + 1, res_sqcoeff);

    error += temp1[0] + temp1[1] + temp1[2] + temp1[3];
    sqcoeff += temp1[4] + temp1[5] + temp1[6] + temp1[7];
  }
  error = (error + rounding) >> shift;
  sqcoeff = (sqcoeff + rounding) >> shift;

  *ssz = sqcoeff;
  return error;
}